

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O1

anon_class_24_3_67308ef9 * __thiscall
google::protobuf::internal::ExtensionSet::
ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::AppendToList(google::protobuf::Descriptor_const*,google::protobuf::DescriptorPool_const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>*)const::__0>
          (anon_class_24_3_67308ef9 *__return_storage_ptr__,ExtensionSet *this,
          _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
          begin,_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                end,anon_class_24_3_67308ef9 func)

{
  _Rb_tree_color number;
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  *pvVar1;
  iterator iVar2;
  byte bVar3;
  int iVar4;
  FieldDescriptor *in_RAX;
  FieldDescriptor *local_38;
  
  local_38 = in_RAX;
  if ((_Base_ptr)this != begin._M_node) {
    do {
      number = ((_Rb_tree_node_base *)((long)this + 0x20))->_M_color;
      if (*(char *)((long)&((_Rb_tree_node_base *)((long)this + 0x20))->_M_left + 1) == '\x01') {
        iVar4 = Extension::GetSize((Extension *)
                                   &((_Rb_tree_node_base *)((long)this + 0x20))->_M_parent);
        bVar3 = 0 < iVar4;
      }
      else {
        bVar3 = *(byte *)((long)&((_Rb_tree_node_base *)((long)this + 0x20))->_M_left + 2) ^ 1;
      }
      if ((bVar3 & 1) != 0) {
        if (((_Rb_tree_node_base *)((long)this + 0x20))->_M_right == (_Base_ptr)0x0) {
          pvVar1 = (vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)*func.output;
          local_38 = DescriptorPool::FindExtensionByNumber(func.pool,func.containing_type,number);
          iVar2._M_current = *(FieldDescriptor ***)(pvVar1 + 8);
          if (iVar2._M_current == *(FieldDescriptor ***)(pvVar1 + 0x10)) {
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>(pvVar1,iVar2,&local_38);
          }
          else {
            *iVar2._M_current = local_38;
            *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
          }
        }
        else {
          pvVar1 = (vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)*func.output;
          iVar2._M_current = *(FieldDescriptor ***)(pvVar1 + 8);
          if (iVar2._M_current == *(FieldDescriptor ***)(pvVar1 + 0x10)) {
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                      (pvVar1,iVar2,
                       (FieldDescriptor **)&((_Rb_tree_node_base *)((long)this + 0x20))->_M_right);
          }
          else {
            *iVar2._M_current =
                 (FieldDescriptor *)((_Rb_tree_node_base *)((long)this + 0x20))->_M_right;
            *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
          }
        }
      }
      this = (ExtensionSet *)std::_Rb_tree_increment((_Rb_tree_node_base *)this);
    } while ((_Base_ptr)this != begin._M_node);
  }
  __return_storage_ptr__->output = func.output;
  __return_storage_ptr__->containing_type = func.containing_type;
  __return_storage_ptr__->pool = func.pool;
  return __return_storage_ptr__;
}

Assistant:

static KeyValueFunctor ForEach(Iterator begin, Iterator end,
                                 KeyValueFunctor func) {
    for (Iterator it = begin; it != end; ++it) func(it->first, it->second);
    return std::move(func);
  }